

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImBezierCubicClosestPointCasteljau
                 (ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImVec2 *p,float tess_tol)

{
  float p_closest_dist2;
  ImVec2 p_last;
  float local_1c;
  ImVec2 local_18;
  ImVec2 local_10;
  
  local_18 = *p1;
  local_10.x = 0.0;
  local_10.y = 0.0;
  local_1c = 3.4028235e+38;
  ImBezierCubicClosestPointCasteljauStep
            (p,&local_10,&local_18,&local_1c,p1->x,p1->y,p2->x,p2->y,p3->x,p3->y,p4->x,p4->y,
             tess_tol,0);
  return local_10;
}

Assistant:

ImVec2 ImBezierCubicClosestPointCasteljau(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& p, float tess_tol)
{
    IM_ASSERT(tess_tol > 0.0f);
    ImVec2 p_last = p1;
    ImVec2 p_closest;
    float p_closest_dist2 = FLT_MAX;
    ImBezierCubicClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, tess_tol, 0);
    return p_closest;
}